

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

string * testing::(anonymous_namespace)::FormatTimes_abi_cxx11_(int n)

{
  ostream *poVar1;
  int in_ESI;
  string *in_RDI;
  stringstream ss;
  stringstream local_1a8 [8];
  allocator<char> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  allocator<char> local_1d [16];
  allocator<char> local_d;
  int local_c;
  
  if (in_ESI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::allocator<char>::~allocator(&local_d);
  }
  else if (in_ESI == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::allocator<char>::~allocator(local_1d);
  }
  else {
    local_c = in_ESI;
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar1 = (ostream *)std::ostream::operator<<(&stack0xfffffffffffffe68,local_c);
    std::operator<<(poVar1," times");
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return in_RDI;
}

Assistant:

inline internal::string FormatTimes(int n) {
  if (n == 1) {
    return "once";
  } else if (n == 2) {
    return "twice";
  } else {
    std::stringstream ss;
    ss << n << " times";
    return ss.str();
  }
}